

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O1

int __thiscall
amrex::distFcnElement2d::solve_thomas
          (distFcnElement2d *this,vector<double,_std::allocator<double>_> *a,
          vector<double,_std::allocator<double>_> *b,vector<double,_std::allocator<double>_> *c,
          vector<double,_std::allocator<double>_> *d,vector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  uVar7 = (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar6 = (uint)uVar7;
  std::vector<double,_std::allocator<double>_>::resize(x,uVar7 & 0xffffffff);
  if (1 < uVar6) {
    pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      dVar11 = -pdVar1[lVar10] / pdVar2[lVar10];
      pdVar2[lVar10 + 1] = pdVar3[lVar10] * dVar11 + pdVar2[lVar10 + 1];
      pdVar4[lVar10 + 1] = dVar11 * pdVar4[lVar10] + pdVar4[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while ((uVar7 & 0xffffffff) - 1 != lVar10);
  }
  uVar8 = uVar6 - 1;
  pdVar1 = (d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[uVar8] = pdVar1[uVar8] / pdVar2[uVar8];
  uVar6 = uVar6 - 2;
  if (-1 < (int)uVar6) {
    pdVar4 = (c->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = pdVar3[(ulong)uVar6 + 1];
    lVar10 = (ulong)uVar6 + 1;
    do {
      dVar11 = (pdVar1[lVar10 + -1] - dVar11 * pdVar4[lVar10 + -1]) / pdVar2[lVar10 + -1];
      pdVar3[lVar10 + -1] = dVar11;
      lVar9 = lVar10 + -1;
      bVar5 = 0 < lVar10;
      lVar10 = lVar9;
    } while (lVar9 != 0 && bVar5);
  }
  return 0;
}

Assistant:

int distFcnElement2d::solve_thomas(const std::vector<amrex::Real> &a,
                                   std::vector<amrex::Real> b,
                                   const std::vector<amrex::Real> &c,
                                   std::vector<amrex::Real> d,
                                   std::vector<amrex::Real> &x) {
  unsigned n;
  n = d.size();
  x.resize(n);

  amrex::Real m;
  for (unsigned i=1; i < n; ++i) {
    m = a[i-1]/b[i-1];
    b[i] -= m*c[i-1];
    d[i] -= m*d[i-1];
  }

  x[n-1] = d[n-1] / b[n-1];

  for (int i=n-2; i > -1; --i) {
    x[i] = (d[i]-c[i]*x[i+1])/b[i];
  }

  return 0;
}